

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void VP8YuvToRgba444432_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  __m128i B;
  __m128i G;
  __m128i R;
  int n;
  __m128i kAlpha;
  uint8_t *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined2 uVar1;
  __m128i *in_stack_ffffffffffffff58;
  __m128i *in_stack_ffffffffffffff60;
  __m128i *in_stack_ffffffffffffff68;
  __m128i *in_stack_ffffffffffffff78;
  __m128i *in_stack_ffffffffffffff80;
  __m128i *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  uint8_t *u_00;
  uint8_t *y_00;
  
  uVar1 = 0xff;
  u_00 = (uint8_t *)0xff00ff00ff00ff;
  y_00 = (uint8_t *)0xff00ff00ff00ff;
  for (iVar2 = 0; iVar2 < 0x20; iVar2 = iVar2 + 8) {
    YUV444ToRGB_SSE2(y_00,u_00,(uint8_t *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    PackAndStore4444_SSE2
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (__m128i *)CONCAT26(uVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

void VP8YuvToRgba444432_SSE2(const uint8_t* WEBP_RESTRICT y,
                             const uint8_t* WEBP_RESTRICT u,
                             const uint8_t* WEBP_RESTRICT v,
                             uint8_t* WEBP_RESTRICT dst) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n < 32; n += 8, dst += 16) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore4444_SSE2(&R, &G, &B, &kAlpha, dst);
  }
}